

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ParquetScanFunction::ParquetScanDeserialize
          (ParquetScanFunction *this,Deserializer *deserializer,TableFunction *function)

{
  case_insensitive_map_t<LogicalType> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  case_insensitive_map_t<Value> *this_01;
  pointer pbVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  pointer pPVar6;
  pointer pPVar7;
  pointer pPVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ClientContext *context;
  long *plVar10;
  pointer pFVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  long lVar12;
  pointer __args;
  MultiFileReader local_310;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  files;
  shared_ptr<duckdb::MultiFileList,_true> file_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  shared_ptr<duckdb::MultiFileList,_true> local_298;
  vector<duckdb::Value,_true> file_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  table_columns;
  vector<duckdb::Value,_true> local_248;
  LogicalType local_230;
  vector<duckdb::LogicalType,_true> types;
  type ret;
  undefined1 local_128 [32];
  vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_e8;
  MultiFileOptions local_c8;
  
  local_310.function_name.field_2._8_8_ = Deserializer::Get<duckdb::ClientContext&>(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"files");
  files.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  files.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar9 = (*deserializer->_vptr_Deserializer[8])(deserializer);
  lVar12 = CONCAT44(extraout_var,iVar9);
  if (lVar12 != 0) {
    do {
      (*deserializer->_vptr_Deserializer[0x1a])(&ret,deserializer);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&files,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          CONCAT62(ret.parquet_options._2_6_,ret.parquet_options._0_2_) !=
          &ret.parquet_options.encryption_config.internal.
           super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount) {
        operator_delete((undefined1 *)CONCAT62(ret.parquet_options._2_6_,ret.parquet_options._0_2_))
        ;
      }
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  (*deserializer->_vptr_Deserializer[9])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            (&types,deserializer,0x65,"types");
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"names");
  names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar9 = (*deserializer->_vptr_Deserializer[8])(deserializer);
  lVar12 = CONCAT44(extraout_var_00,iVar9);
  if (lVar12 != 0) {
    do {
      (*deserializer->_vptr_Deserializer[0x1a])(&ret,deserializer);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&names,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          CONCAT62(ret.parquet_options._2_6_,ret.parquet_options._0_2_) !=
          &ret.parquet_options.encryption_config.internal.
           super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount) {
        operator_delete((undefined1 *)CONCAT62(ret.parquet_options._2_6_,ret.parquet_options._0_2_))
        ;
      }
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  (*deserializer->_vptr_Deserializer[9])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x67,"parquet_options");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  ParquetOptionsSerialization::Deserialize(&ret,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  local_e8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Deserializer::ReadPropertyWithExplicitDefault<duckdb::vector<std::__cxx11::string,true>>
            (&table_columns,deserializer,0x68,"table_columns",&local_e8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_e8);
  pbVar3 = files.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  file_path.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  file_path.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  file_path.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_310.function_name.field_2._M_allocated_capacity = (size_type)&table_columns;
  if (files.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      files.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __args = files.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
      emplace_back<std::__cxx11::string&>
                ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&file_path,__args);
      __args = __args + 1;
    } while (__args != pbVar3);
  }
  MultiFileReader::Create(&local_310,function);
  context = (ClientContext *)
            unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
            ::operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                          *)&local_310);
  LogicalType::LogicalType(&local_230,VARCHAR);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_248,
             &file_path.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
  Value::LIST((Value *)local_128,&local_230,&local_248);
  MultiFileReader::CreateFileList
            ((MultiFileReader *)&file_list,context,(Value *)local_310.function_name.field_2._8_8_,
             (FileGlobOptions)local_128);
  Value::~Value((Value *)local_128);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_248);
  LogicalType::~LogicalType(&local_230);
  plVar10 = (long *)operator_new(0x48);
  pPVar8 = ret.parquet_options.schema.
           super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
           .
           super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pPVar7 = ret.parquet_options.schema.
           super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
           .
           super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pPVar6 = ret.parquet_options.schema.
           super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
           .
           super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var5 = ret.parquet_options.encryption_config.internal.
          super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  peVar4 = ret.parquet_options.encryption_config.internal.
           super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_128[0] = ret.parquet_options.binary_as_string;
  local_128[1] = ret.parquet_options.file_row_number;
  ret.parquet_options.encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ret.parquet_options.encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_128[0x18] = ret.parquet_options.debug_use_openssl;
  ret.parquet_options.schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ret.parquet_options.schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ret.parquet_options.schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ret.parquet_options.explicit_cardinality;
  *plVar10 = (long)&PTR__ParquetFileReaderOptions_019a4a08;
  *(undefined2 *)(plVar10 + 1) = ret.parquet_options._0_2_;
  local_128._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar10[2] = (long)peVar4;
  plVar10[3] = (long)_Var5._M_pi;
  local_128._8_8_ = (element_type *)0x0;
  *(bool *)(plVar10 + 4) = ret.parquet_options.debug_use_openssl;
  plVar10[5] = (long)pPVar6;
  plVar10[6] = (long)pPVar7;
  plVar10[7] = (long)pPVar8;
  local_108.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  plVar10[8] = ret.parquet_options.explicit_cardinality;
  ::std::vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>::
  ~vector((vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
           *)(local_128 + 0x20));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._16_8_);
  }
  local_310.function_name._M_string_length = (size_type)local_310._vptr_MultiFileReader;
  local_310._vptr_MultiFileReader = (_func_int **)0x0;
  local_298.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_298.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &ret.file_options.hive_types_schema;
  local_c8.filename = ret.file_options.filename;
  local_c8.hive_partitioning = ret.file_options.hive_partitioning;
  local_c8.auto_detect_hive_partitioning = ret.file_options.auto_detect_hive_partitioning;
  local_c8.union_by_name = ret.file_options.union_by_name;
  local_c8.hive_types_autocast = ret.file_options.hive_types_autocast;
  local_c8.mapping = ret.file_options.mapping;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_c8.hive_types_schema._M_h,this_00,this_00);
  paVar1 = &local_c8.filename_column.field_2;
  paVar2 = &ret.file_options.filename_column.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ret.file_options.filename_column._M_dataplus._M_p == paVar2) {
    local_c8.filename_column.field_2._8_4_ = ret.file_options.filename_column.field_2._8_4_;
    local_c8.filename_column.field_2._12_4_ = ret.file_options.filename_column.field_2._12_4_;
    local_c8.filename_column._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c8.filename_column._M_dataplus._M_p = ret.file_options.filename_column._M_dataplus._M_p;
  }
  this_01 = &ret.file_options.custom_options;
  local_c8.filename_column._M_string_length = ret.file_options.filename_column._M_string_length;
  ret.file_options.filename_column._M_string_length = 0;
  ret.file_options.filename_column.field_2._M_allocated_capacity._0_4_ =
       ret.file_options.filename_column.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  ret.file_options.filename_column._M_dataplus._M_p = (pointer)paVar2;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_c8.custom_options._M_h,this_01,this_01);
  local_310.function_name._M_dataplus._M_p = (pointer)plVar10;
  MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileBindInternal
            ((MultiFileFunction<duckdb::ParquetMultiFileInfo> *)this,
             (ClientContext *)local_310.function_name.field_2._8_8_,
             (unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
              *)&local_310.function_name._M_string_length,&local_298,&types,&names,&local_c8,
             (unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
              *)&local_310.function_name);
  if ((long *)local_310.function_name._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_310.function_name._M_dataplus._M_p + 8))();
  }
  local_310.function_name._M_dataplus._M_p = (pointer)0x0;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_c8.custom_options._M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.filename_column._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.filename_column._M_dataplus._M_p);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_c8.hive_types_schema._M_h);
  if (local_298.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_298.internal.
               super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_func_int **)local_310.function_name._M_string_length != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_310.function_name._M_string_length + 8))();
  }
  local_310.function_name._M_string_length = 0;
  pFVar11 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                        *)this);
  local_128._16_8_ = pFVar11[0x35]._vptr_FunctionData;
  pFVar11[0x35]._vptr_FunctionData =
       (_func_int **)
       table_columns.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_128._0_8_ = pFVar11[0x33]._vptr_FunctionData;
  local_128._8_8_ = pFVar11[0x34]._vptr_FunctionData;
  pFVar11[0x33]._vptr_FunctionData =
       (_func_int **)
       table_columns.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pFVar11[0x34]._vptr_FunctionData =
       (_func_int **)
       table_columns.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  table_columns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  table_columns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  table_columns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_128);
  if (file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (file_list.internal.
               super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_310._vptr_MultiFileReader != (_func_int **)0x0) {
    (**(code **)(*local_310._vptr_MultiFileReader + 8))();
  }
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&file_path);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&table_columns);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&this_01->_M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ret.file_options.filename_column._M_dataplus._M_p !=
      &ret.file_options.filename_column.field_2) {
    operator_delete(ret.file_options.filename_column._M_dataplus._M_p);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&this_00->_M_h);
  ::std::vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>::
  ~vector(&ret.parquet_options.schema.
           super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
         );
  if (ret.parquet_options.encryption_config.internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (ret.parquet_options.encryption_config.internal.
               super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&names);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&types);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&files);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> ParquetScanDeserialize(Deserializer &deserializer, TableFunction &function) {
		auto &context = deserializer.Get<ClientContext &>();
		auto files = deserializer.ReadProperty<vector<string>>(100, "files");
		auto types = deserializer.ReadProperty<vector<LogicalType>>(101, "types");
		auto names = deserializer.ReadProperty<vector<string>>(102, "names");
		auto serialization = deserializer.ReadProperty<ParquetOptionsSerialization>(103, "parquet_options");
		auto table_columns =
		    deserializer.ReadPropertyWithExplicitDefault<vector<string>>(104, "table_columns", vector<string> {});

		vector<Value> file_path;
		for (auto &path : files) {
			file_path.emplace_back(path);
		}

		auto multi_file_reader = MultiFileReader::Create(function);
		auto file_list = multi_file_reader->CreateFileList(context, Value::LIST(LogicalType::VARCHAR, file_path),
		                                                   FileGlobOptions::DISALLOW_EMPTY);
		auto parquet_options = make_uniq<ParquetFileReaderOptions>(std::move(serialization.parquet_options));
		auto bind_data = MultiFileFunction<ParquetMultiFileInfo>::MultiFileBindInternal(
		    context, std::move(multi_file_reader), std::move(file_list), types, names,
		    std::move(serialization.file_options), std::move(parquet_options));
		bind_data->Cast<MultiFileBindData>().table_columns = std::move(table_columns);
		return bind_data;
	}